

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftLCbound(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *to)

{
  type_conflict5 tVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  double local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_68,
             &(this->theCoLbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&to->m_backend);
  local_b0 = 0.0;
  tVar1 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_68,&local_b0);
  if (tVar1) {
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 10;
    local_a8.data._M_elems[0] = 0;
    local_a8.data._M_elems[1] = 0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems._24_5_ = 0;
    local_a8.data._M_elems[7]._1_3_ = 0;
    local_a8.data._M_elems._32_5_ = 0;
    local_a8._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_a8,
               &(this->theCoLbound->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&to->m_backend);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_a8,0.0,(type *)0x0);
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(this->theShift).m_backend,&local_a8);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(this->theCoLbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&to->m_backend);
  return;
}

Assistant:

void shiftLCbound(int i, R to)
   {
      assert(theType == LEAVE);
      // use maximum to not count tightened bounds in case of equality shifts
      theShift += SOPLEX_MAX((*theCoLbound)[i] - to, 0.0);
      (*theCoLbound)[i] = to;
   }